

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.hpp
# Opt level: O2

int __thiscall front::symbol::ArraySymbol::getLen(ArraySymbol *this)

{
  int iVar1;
  int iVar2;
  shared_ptr<front::symbol::Symbol> local_28;
  
  iVar2 = this->_size;
  if (iVar2 == -1) {
    getSize(this);
    iVar2 = this->_size;
  }
  std::static_pointer_cast<front::symbol::IntSymbol,front::symbol::Symbol>(&local_28);
  iVar1 = *(int *)&local_28.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr[1]._name._M_dataplus._M_p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_28.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return iVar2 / iVar1;
}

Assistant:

int getLen() {
    if (_size == -1) {
      getSize();
    }

    return _size / static_pointer_cast<IntSymbol>(_item)->getSize();
  }